

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall Memory::Recycler::SetMemProtectMode(Recycler *this)

{
  ConfigFlagsTable *pCVar1;
  
  this->enableScanInteriorPointers = true;
  this->enableScanImplicitRoots = true;
  this->disableCollectOnAllocationHeuristics = true;
  pCVar1 = this->recyclerFlagsTable;
  this->recyclerStress = pCVar1->MemProtectHeapStress;
  this->recyclerBackgroundStress = pCVar1->MemProtectHeapBackgroundStress;
  this->recyclerConcurrentStress = pCVar1->MemProtectHeapConcurrentStress;
  this->recyclerConcurrentRepeatStress = pCVar1->MemProtectHeapConcurrentRepeatStress;
  this->recyclerPartialStress = pCVar1->MemProtectHeapPartialStress;
  return;
}

Assistant:

void
Recycler::SetMemProtectMode()
{
    this->enableScanInteriorPointers = true;
    this->enableScanImplicitRoots = true;
    this->disableCollectOnAllocationHeuristics = true;
#ifdef RECYCLER_STRESS
    this->recyclerStress = GetRecyclerFlagsTable().MemProtectHeapStress;
#if ENABLE_CONCURRENT_GC
    this->recyclerBackgroundStress = GetRecyclerFlagsTable().MemProtectHeapBackgroundStress;
    this->recyclerConcurrentStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentStress;
    this->recyclerConcurrentRepeatStress = GetRecyclerFlagsTable().MemProtectHeapConcurrentRepeatStress;
#endif
#if ENABLE_PARTIAL_GC
    this->recyclerPartialStress = GetRecyclerFlagsTable().MemProtectHeapPartialStress;
#endif
#endif
}